

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O0

LLVMPointerAnalysisOptions *
dg::DGLLVMPointerAnalysis::createOptions(char *entry_func,uint64_t field_sensitivity,bool threads)

{
  byte in_CL;
  type in_RDX;
  char *in_RSI;
  LLVMPointerAnalysisOptions *in_RDI;
  LLVMPointerAnalysisOptions *opts;
  string *in_stack_ffffffffffffff88;
  LLVMPointerAnalysisOptions *this;
  AnalysisOptions *this_00;
  Offset in_stack_ffffffffffffffa0;
  allocator local_49;
  string local_48 [32];
  Offset local_28;
  undefined1 local_1a;
  byte local_19;
  type local_18;
  char *local_10;
  
  local_19 = in_CL & 1;
  local_1a = 0;
  this = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  LLVMPointerAnalysisOptions::LLVMPointerAnalysisOptions(in_RDI);
  in_RDI->threads = (bool)(local_19 & 1);
  this_00 = &(in_RDI->super_PointerAnalysisOptions).super_AnalysisOptions;
  Offset::Offset(&local_28,local_18);
  AnalysisOptions::setFieldSensitivity(this_00,in_stack_ffffffffffffffa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,local_10,&local_49);
  LLVMAnalysisOptions::setEntryFunction(&this->super_LLVMAnalysisOptions,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return this;
}

Assistant:

static LLVMPointerAnalysisOptions createOptions(const char *entry_func,
                                                    uint64_t field_sensitivity,
                                                    bool threads = false) {
        LLVMPointerAnalysisOptions opts;
        opts.threads = threads;
        opts.setFieldSensitivity(field_sensitivity);
        opts.setEntryFunction(entry_func);
        return opts;
    }